

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall
ON_AngularDimension2Extra::ON_AngularDimension2Extra(ON_AngularDimension2Extra *this)

{
  ON_UUID OVar1;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081fda0;
  OVar1 = ON_ClassId::Uuid(&m_ON_AngularDimension2Extra_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar1;
  (this->super_ON_UserData).m_application_uuid.Data1 = 0xc8cda597;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0xd957;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4625;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0xa4;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 0xb3;
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 0xa0;
  (this->super_ON_UserData).m_application_uuid.Data4[3] = 0xb5;
  (this->super_ON_UserData).m_application_uuid.Data4[4] = '\x10';
  (this->super_ON_UserData).m_application_uuid.Data4[5] = 0xfc;
  (this->super_ON_UserData).m_application_uuid.Data4[6] = '0';
  (this->super_ON_UserData).m_application_uuid.Data4[7] = 0xd4;
  (this->super_ON_UserData).m_userdata_copycount = 1;
  this->m_dimpoint_offset[0] = 0.0;
  this->m_dimpoint_offset[1] = 0.0;
  return;
}

Assistant:

ON_AngularDimension2Extra::ON_AngularDimension2Extra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_AngularDimension2Extra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;

  m_dimpoint_offset[0] = 0;
  m_dimpoint_offset[1] = 0;
}